

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu-aarch64.cpp
# Opt level: O1

void ggml::cpu::aarch64::gemv<block_iq4_nl,4l,4l,(ggml_type)8>
               (int n,float *s,size_t bs,void *vx,void *vy,int nr,int nc)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  long lVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  void *pvVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  void *local_70;
  long local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  float sumf [4];
  
  if (3 < nc) {
    iVar11 = n + 0x1f;
    if (-1 < n) {
      iVar11 = n;
    }
    lVar7 = (long)(iVar11 >> 5) * 0x48;
    local_60 = (long)vx + 8;
    uVar10 = 0;
    auVar19._8_4_ = 0xf;
    auVar19._0_8_ = 0xf0000000f;
    auVar19._12_4_ = 0xf;
    local_70 = vx;
    do {
      local_58 = 0;
      uStack_50 = 0;
      if (0x1f < n) {
        uVar17 = 0;
        lVar14 = local_60;
        pvVar18 = local_70;
        do {
          lVar8 = uVar17 * 0x22;
          uVar1 = *(uint *)(&ggml_table_f32_f16 + (ulong)*(ushort *)((long)vy + lVar8) * 4);
          lVar12 = 0;
          lVar16 = lVar14;
          do {
            auVar2 = vpmovsxbd_avx(ZEXT416(*(uint *)((long)vy + lVar12 * 4 + lVar8 + 2)));
            auVar3 = vpmovsxbd_avx(ZEXT416(*(uint *)((long)vy + lVar12 * 4 + lVar8 + 0x12)));
            lVar13 = 0;
            do {
              auVar4 = vpmovzxbd_avx(ZEXT416(*(uint *)(lVar16 + lVar13 * 4)));
              auVar20 = vpand_avx(auVar4,auVar19);
              auVar6 = vpmovzxdq_avx2(auVar20);
              lVar9 = vpextrq_avx(auVar6._0_16_,1);
              lVar15 = vpextrq_avx(auVar6._16_16_,1);
              auVar20 = vpinsrb_avx(ZEXT116((byte)kvalues_iq4nl[auVar6._0_8_]),
                                    (uint)(byte)kvalues_iq4nl[lVar9],1);
              auVar20 = vpinsrb_avx(auVar20,(uint)(byte)kvalues_iq4nl[auVar6._16_8_],2);
              auVar20 = vpinsrb_avx(auVar20,(uint)(byte)kvalues_iq4nl[lVar15],3);
              auVar20 = vpmovsxbd_avx(auVar20);
              auVar5 = vpmulld_avx(auVar2,auVar20);
              auVar20 = vpsrld_avx(auVar4,4);
              auVar6 = vpmovzxdq_avx2(auVar20);
              lVar9 = vpextrq_avx(auVar6._0_16_,1);
              lVar15 = vpextrq_avx(auVar6._16_16_,1);
              auVar20 = vpinsrb_avx(ZEXT116((byte)kvalues_iq4nl[auVar6._0_8_]),
                                    (uint)(byte)kvalues_iq4nl[lVar9],1);
              auVar20 = vpinsrb_avx(auVar20,(uint)(byte)kvalues_iq4nl[auVar6._16_8_],2);
              auVar20 = vpinsrb_avx(auVar20,(uint)(byte)kvalues_iq4nl[lVar15],3);
              auVar20 = vpmovsxbd_avx(auVar20);
              auVar20 = vpmulld_avx(auVar3,auVar20);
              auVar20 = vpaddd_avx(auVar5,auVar20);
              auVar20 = vphaddd_avx(auVar20,auVar20);
              auVar20 = vphaddd_avx(auVar20,auVar20);
              auVar20 = vcvtdq2ps_avx(auVar20);
              auVar20 = vfmadd213ss_fma(ZEXT416((uint)(auVar20._0_4_ *
                                                      *(float *)(&ggml_table_f32_f16 +
                                                                (ulong)*(ushort *)
                                                                        ((long)pvVar18 + lVar13 * 2)
                                                                * 4))),ZEXT416(uVar1),
                                        ZEXT416(*(uint *)((long)&local_58 + lVar13 * 4)));
              *(int *)((long)&local_58 + lVar13 * 4) = auVar20._0_4_;
              lVar13 = lVar13 + 1;
            } while (lVar13 != 4);
            lVar12 = lVar12 + 1;
            lVar16 = lVar16 + 0x10;
          } while (lVar12 != 4);
          uVar17 = uVar17 + 1;
          lVar14 = lVar14 + 0x48;
          pvVar18 = (void *)((long)pvVar18 + 0x48);
        } while (uVar17 != (uint)(iVar11 >> 5));
      }
      *(undefined8 *)(s + uVar10 * 4) = local_58;
      *(undefined8 *)(s + uVar10 * 4 + 2) = uStack_50;
      uVar10 = uVar10 + 1;
      local_60 = local_60 + lVar7;
      local_70 = (void *)((long)local_70 + lVar7);
    } while (uVar10 != (uint)nc >> 2);
  }
  return;
}

Assistant:

void gemv<block_iq4_nl, 4, 4, GGML_TYPE_Q8_0>(int n, float * s, size_t bs, const void * vx, const void * vy, int nr, int nc) {
    ggml_gemv_iq4_nl_4x4_q8_0(n, s, bs, vx, vy, nr, nc);
}